

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_unittest.h
# Opt level: O3

void __thiscall
google::protobuf::internal::gtest_suite_WireFormatInvalidInputTest_::
InvalidSubMessage<proto2_unittest::TestAllTypes>::TestBody
          (InvalidSubMessage<proto2_unittest::TestAllTypes> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  char *in_R9;
  pointer *__ptr;
  string_view data;
  string_view data_00;
  string_view data_01;
  string_view data_02;
  string_view data_03;
  TestAllTypes message;
  AssertHelper AStack_398;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_390;
  string local_388;
  internal local_368 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_360;
  TestAllTypes local_358;
  
  proto2_unittest::TestAllTypes::TestAllTypes(&local_358,(Arena *)0x0);
  WireFormatInvalidInputTest<proto2_unittest::TestAllTypes>::MakeInvalidEmbeddedMessage_abi_cxx11_
            (&local_388,&this->super_WireFormatInvalidInputTest<proto2_unittest::TestAllTypes>,
             anon_var_dwarf_a22956 + 5,0);
  data._M_str = local_388._M_dataplus._M_p;
  data._M_len = local_388._M_string_length;
  local_368[0] = (internal)MessageLite::ParseFromString((MessageLite *)&local_358,data);
  local_360 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  paVar1 = &local_388.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p == paVar1) {
    if (!(bool)local_368[0]) goto LAB_009e5562;
  }
  else {
    operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
    if (((byte)local_368[0] & 1) == 0) {
LAB_009e5562:
      testing::Message::Message((Message *)&local_390);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_388,local_368,
                 (AssertionResult *)
                 "message.ParseFromString(this->MakeInvalidEmbeddedMessage(\"\", 0))","false","true"
                 ,in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&AStack_398,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
                 ,0x55b,local_388._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&AStack_398,(Message *)&local_390);
      testing::internal::AssertHelper::~AssertHelper(&AStack_398);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_388._M_dataplus._M_p != paVar1) {
        operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
      }
      if (local_390._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_390._M_head_impl + 8))();
      }
    }
  }
  if (local_360 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_360,local_360);
  }
  WireFormatInvalidInputTest<proto2_unittest::TestAllTypes>::MakeInvalidEmbeddedMessage_abi_cxx11_
            (&local_388,&this->super_WireFormatInvalidInputTest<proto2_unittest::TestAllTypes>,"",1)
  ;
  data_00._M_str = local_388._M_dataplus._M_p;
  data_00._M_len = local_388._M_string_length;
  bVar2 = MessageLite::ParseFromString((MessageLite *)&local_358,data_00);
  local_368[0] = (internal)!bVar2;
  local_360 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p == paVar1) {
    if (bVar2) goto LAB_009e5669;
  }
  else {
    operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
    if (((byte)local_368[0] & 1) == 0) {
LAB_009e5669:
      testing::Message::Message((Message *)&local_390);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_388,local_368,
                 (AssertionResult *)
                 "message.ParseFromString(this->MakeInvalidEmbeddedMessage(\"\\0\", 1))","true",
                 "false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&AStack_398,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
                 ,0x55f,local_388._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&AStack_398,(Message *)&local_390);
      testing::internal::AssertHelper::~AssertHelper(&AStack_398);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_388._M_dataplus._M_p != paVar1) {
        operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
      }
      if (local_390._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_390._M_head_impl + 8))();
      }
    }
  }
  if (local_360 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_360,local_360);
  }
  WireFormatInvalidInputTest<proto2_unittest::TestAllTypes>::MakeInvalidEmbeddedMessage_abi_cxx11_
            (&local_388,&this->super_WireFormatInvalidInputTest<proto2_unittest::TestAllTypes>,
             anon_var_dwarf_84da2b,1);
  data_01._M_str = local_388._M_dataplus._M_p;
  data_01._M_len = local_388._M_string_length;
  bVar2 = MessageLite::ParseFromString((MessageLite *)&local_358,data_01);
  local_368[0] = (internal)!bVar2;
  local_360 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p == paVar1) {
    if (bVar2) goto LAB_009e5770;
  }
  else {
    operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
    if (((byte)local_368[0] & 1) == 0) {
LAB_009e5770:
      testing::Message::Message((Message *)&local_390);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_388,local_368,
                 (AssertionResult *)
                 "message.ParseFromString(this->MakeInvalidEmbeddedMessage(\"\\200\", 1))","true",
                 "false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&AStack_398,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
                 ,0x563,local_388._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&AStack_398,(Message *)&local_390);
      testing::internal::AssertHelper::~AssertHelper(&AStack_398);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_388._M_dataplus._M_p != paVar1) {
        operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
      }
      if (local_390._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_390._M_head_impl + 8))();
      }
    }
  }
  if (local_360 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_360,local_360);
  }
  WireFormatInvalidInputTest<proto2_unittest::TestAllTypes>::MakeInvalidEmbeddedMessage_abi_cxx11_
            (&local_388,&this->super_WireFormatInvalidInputTest<proto2_unittest::TestAllTypes>,"\f",
             1);
  data_02._M_str = local_388._M_dataplus._M_p;
  data_02._M_len = local_388._M_string_length;
  bVar2 = MessageLite::ParseFromString((MessageLite *)&local_358,data_02);
  local_368[0] = (internal)!bVar2;
  local_360 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p == paVar1) {
    if (!bVar2) goto LAB_009e58ff;
  }
  else {
    operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
    if (((byte)local_368[0] & 1) != 0) goto LAB_009e58ff;
  }
  testing::Message::Message((Message *)&local_390);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            (&local_388,local_368,
             (AssertionResult *)
             "message.ParseFromString(this->MakeInvalidEmbeddedMessage(\"\\014\", 1))","true",
             "false",in_R9);
  testing::internal::AssertHelper::AssertHelper
            (&AStack_398,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
             ,0x567,local_388._M_dataplus._M_p);
  testing::internal::AssertHelper::operator=(&AStack_398,(Message *)&local_390);
  testing::internal::AssertHelper::~AssertHelper(&AStack_398);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != paVar1) {
    operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
  }
  if (local_390._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_390._M_head_impl + 8))();
  }
LAB_009e58ff:
  if (local_360 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_360,local_360);
  }
  WireFormatInvalidInputTest<proto2_unittest::TestAllTypes>::MakeInvalidEmbeddedMessage_abi_cxx11_
            (&local_388,&this->super_WireFormatInvalidInputTest<proto2_unittest::TestAllTypes>,
             "\x0f",1);
  data_03._M_str = local_388._M_dataplus._M_p;
  data_03._M_len = local_388._M_string_length;
  bVar2 = MessageLite::ParseFromString((MessageLite *)&local_358,data_03);
  local_368[0] = (internal)!bVar2;
  local_360 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != paVar1) {
    operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
  }
  if (bVar2) {
    testing::Message::Message((Message *)&local_390);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_388,local_368,
               (AssertionResult *)
               "message.ParseFromString(this->MakeInvalidEmbeddedMessage(\"\\017\", 1))","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
               ,0x56b,local_388._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&AStack_398,(Message *)&local_390);
    testing::internal::AssertHelper::~AssertHelper(&AStack_398);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_388._M_dataplus._M_p != paVar1) {
      operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
    }
    if (local_390._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_390._M_head_impl + 8))();
    }
    if (local_360 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_360,local_360);
    }
  }
  proto2_unittest::TestAllTypes::~TestAllTypes(&local_358);
  return;
}

Assistant:

TYPED_TEST_P(WireFormatInvalidInputTest, InvalidSubMessage) {
  typename TestFixture::TestAllTypes message;

  // Control case.
  EXPECT_TRUE(message.ParseFromString(this->MakeInvalidEmbeddedMessage("", 0)));

  // The byte is a valid varint, but not a valid tag (zero).
  EXPECT_FALSE(
      message.ParseFromString(this->MakeInvalidEmbeddedMessage("\0", 1)));

  // The byte is a malformed varint.
  EXPECT_FALSE(
      message.ParseFromString(this->MakeInvalidEmbeddedMessage("\200", 1)));

  // The byte is an endgroup tag, but we aren't parsing a group.
  EXPECT_FALSE(
      message.ParseFromString(this->MakeInvalidEmbeddedMessage("\014", 1)));

  // The byte is a valid varint but not a valid tag (bad wire type).
  EXPECT_FALSE(
      message.ParseFromString(this->MakeInvalidEmbeddedMessage("\017", 1)));
}